

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_chol_t * matd_chol(matd_t *A)

{
  matd_t mVar1;
  uint uVar2;
  matd_t *pmVar3;
  matd_chol_t *pmVar4;
  ulong uVar5;
  double dVar6;
  matd_chol_t *chol;
  int k;
  double s;
  int j_1;
  int j;
  double d;
  int i;
  int is_spd;
  matd_t *U;
  int N;
  matd_t *A_local;
  
  if (A->nrows != A->ncols) {
    __assert_fail("A->nrows == A->ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x72d,"matd_chol_t *matd_chol(matd_t *)");
  }
  uVar2 = A->nrows;
  pmVar3 = matd_copy(A);
  d._4_4_ = 1;
  for (d._0_4_ = 0; d._0_4_ < (int)uVar2; d._0_4_ = d._0_4_ + 1) {
    _j_1 = pmVar3[(ulong)(d._0_4_ * pmVar3->ncols + d._0_4_) + 1];
    d._4_4_ = 0.0 < (double)_j_1 & d._4_4_;
    if ((double)_j_1 < 1e-08) {
      j_1 = 0xe2308c3a;
      j = 0x3e45798e;
    }
    dVar6 = sqrt((double)_j_1);
    for (s._4_4_ = d._0_4_; s._0_4_ = d._0_4_, s._4_4_ < (int)uVar2; s._4_4_ = s._4_4_ + 1) {
      uVar5 = (ulong)(d._0_4_ * pmVar3->ncols + s._4_4_);
      pmVar3[uVar5 + 1] = (matd_t)((1.0 / dVar6) * (double)pmVar3[uVar5 + 1]);
    }
    while (s._0_4_ = s._0_4_ + 1, s._0_4_ < (int)uVar2) {
      mVar1 = pmVar3[(ulong)(d._0_4_ * pmVar3->ncols + s._0_4_) + 1];
      if (((double)mVar1 != 0.0) || (NAN((double)mVar1))) {
        for (chol._4_4_ = s._0_4_; chol._4_4_ < (int)uVar2; chol._4_4_ = chol._4_4_ + 1) {
          uVar5 = (ulong)(s._0_4_ * pmVar3->ncols + chol._4_4_);
          pmVar3[uVar5 + 1] =
               (matd_t)(-(double)pmVar3[(ulong)(d._0_4_ * pmVar3->ncols + chol._4_4_) + 1] *
                        (double)mVar1 + (double)pmVar3[uVar5 + 1]);
        }
      }
    }
  }
  pmVar4 = (matd_chol_t *)calloc(1,0x10);
  pmVar4->is_spd = d._4_4_;
  pmVar4->u = pmVar3;
  return pmVar4;
}

Assistant:

matd_chol_t *matd_chol(matd_t *A)
{
    assert(A->nrows == A->ncols);
    int N = A->nrows;

    // make upper right
    matd_t *U = matd_copy(A);

    // don't actually need to clear lower-left... we won't touch it.
/*    for (int i = 0; i < U->nrows; i++) {
      for (int j = 0; j < i; j++) {
//            assert(MATD_EL(U, i, j) == MATD_EL(U, j, i));
MATD_EL(U, i, j) = 0;
}
}
*/
    int is_spd = 1; // (A->nrows == A->ncols);

    for (int i = 0; i < N; i++) {
        double d = MATD_EL(U, i, i);
        is_spd &= (d > 0);

        if (d < MATD_EPS)
            d = MATD_EPS;
        d = 1.0 / sqrt(d);

        for (int j = i; j < N; j++)
            MATD_EL(U, i, j) *= d;

        for (int j = i+1; j < N; j++) {
            double s = MATD_EL(U, i, j);

            if (s == 0)
                continue;

            for (int k = j; k < N; k++) {
                MATD_EL(U, j, k) -= MATD_EL(U, i, k)*s;
            }
        }
    }

    matd_chol_t *chol = calloc(1, sizeof(matd_chol_t));
    chol->is_spd = is_spd;
    chol->u = U;
    return chol;
}